

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O0

void __thiscall xmrig::DonateStrategy::setState(DonateStrategy *this,State state)

{
  Timer *this_00;
  uint in_ESI;
  long *in_RDI;
  State prev;
  uint64_t waitTime;
  uint64_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffe0;
  int iVar1;
  
  if (*(uint *)(in_RDI + 0x13) != in_ESI) {
    iVar1 = (int)in_RDI[0x13];
    *(uint *)(in_RDI + 0x13) = in_ESI;
    this_00 = (Timer *)(ulong)in_ESI;
    switch(this_00) {
    case (Timer *)0x0:
      break;
    case (Timer *)0x1:
      if (iVar1 == 0) {
        idle((DonateStrategy *)(ulong)in_stack_ffffffffffffffe0,(double)in_RDI,(double)this_00);
      }
      else if (iVar1 == 2) {
        Timer::start(this_00,in_stack_ffffffffffffffc8,0x23c06e);
      }
      else {
        (**(code **)(*(long *)in_RDI[0x11] + 0x38))();
        if (in_RDI[0x10] != 0) {
          (**(code **)(*(long *)in_RDI[0x10] + 0x98))();
          in_RDI[0x10] = 0;
        }
        idle((DonateStrategy *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(double)in_RDI,
             (double)this_00);
      }
      break;
    case (Timer *)0x2:
      (**(code **)(*in_RDI + 0x28))();
      break;
    case (Timer *)0x3:
      Timer::start(this_00,in_stack_ffffffffffffffc8,0x23c0fa);
      break;
    case (Timer *)0x4:
      in_RDI[0x19] = in_RDI[0x18] + 3000;
      (**(code **)(*(long *)in_RDI[0x12] + 0x28))();
    }
  }
  return;
}

Assistant:

void xmrig::DonateStrategy::setState(State state)
{
    constexpr const uint64_t waitTime = 3000;

    assert(m_state != state && state != STATE_NEW);
    if (m_state == state) {
        return;
    }

    const State prev = m_state;
    m_state = state;

    switch (state) {
    case STATE_NEW:
        break;

    case STATE_IDLE:
        if (prev == STATE_NEW) {
            idle(0.5, 1.5);
        }
        else if (prev == STATE_CONNECT) {
            m_timer->start(20000, 0);
        }
        else {
            m_strategy->stop();
            if (m_proxy) {
                m_proxy->deleteLater();
                m_proxy = nullptr;
            }

            idle(0.8, 1.2);
        }
        break;

    case STATE_CONNECT:
        connect();
        break;

    case STATE_ACTIVE:
        m_timer->start(m_donateTime, 0);
        break;

    case STATE_WAIT:
        m_timestamp = m_now + waitTime;
        m_listener->onPause(this);
        break;
    }
}